

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protodec.c
# Opt level: O3

int protodec_calculate_crc(int length_bits,demod_state_t *d)

{
  uint len;
  unsigned_short uVar1;
  uchar *data;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  
  if (length_bits < 1) {
    return 0;
  }
  len = ((uint)length_bits >> 3) + 2;
  data = (uchar *)hmalloc((ulong)len);
  lVar2 = 0;
  uVar4 = 0;
  do {
    lVar3 = 0;
    bVar6 = 0;
    do {
      bVar6 = bVar6 | d->buffer[lVar3 + lVar2] << ((byte)lVar3 & 0x1f);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
    data[uVar4] = bVar6;
    uVar4 = uVar4 + 1;
    lVar2 = lVar2 + 8;
  } while (uVar4 != len);
  uVar1 = protodec_sdlc_crc(data,len);
  memset(d->rbuffer,0,0x1c2);
  if (7 < (uint)length_bits) {
    uVar4 = 0;
    uVar5 = 0;
    do {
      lVar2 = 8;
      uVar7 = uVar4;
      do {
        if (0x1c1 < uVar7) {
          hfree(data);
          return 0;
        }
        lVar2 = lVar2 + -1;
        d->rbuffer[uVar7] = (data[uVar5] >> ((uint)lVar2 & 0x1f) & 1) != 0;
        uVar7 = uVar7 + 1;
      } while (lVar2 != 0);
      uVar5 = uVar5 + 1;
      uVar4 = uVar4 + 8;
    } while (uVar5 != (uint)length_bits >> 3);
  }
  hfree(data);
  return (uint)(uVar1 == 0xf47);
}

Assistant:

int protodec_calculate_crc(int length_bits, struct demod_state_t *d)
{
	int length_bytes;
	unsigned char *buf;
	int buflen;
	int i, j, x;
	unsigned char tmp;
	
	if (length_bits <= 0) {
		return 0;
	}
	
	length_bytes = length_bits / 8;
	buflen = length_bytes + 2;
	
	/* what is this? */
	buf = (unsigned char *) hmalloc(sizeof(*buf) * buflen);
	for (j = 0; j < buflen; j++) {
		tmp = 0;
		for (i = 0; i < 8; i++)
			tmp |= (((d->buffer[i + 8 * j]) << (i)));
		buf[j] = tmp;
	}
	
	/* ok, here's the actual CRC calculation */
	unsigned short crc = protodec_sdlc_crc(buf, buflen);
	//DBG(printf("CRC: %04x\n",crc));
	
	/* what is this? */
	memset(d->rbuffer, 0, DEMOD_BUFFER_LEN);
	for (j = 0; j < length_bytes; j++) {
		for (i = 0; i < 8; i++) {
			x = j * 8 + i;
			if (x >= DEMOD_BUFFER_LEN) {
				hfree(buf);
				return 0;
			} else {
				d->rbuffer[x] = (buf[j] >> (7 - i)) & 1;
			}
		}
	}
	
	hfree(buf);
	
	return (crc == 0x0f47);
}